

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWorker.hpp
# Opt level: O3

void __thiscall sftm::CWorker::DoWork(CWorker *this)

{
  CSyncPrimitive *pCVar1;
  __int_type_conflict _Var2;
  uint32_t uVar3;
  CTask *pCVar4;
  bool bVar5;
  uint uVar6;
  
LAB_00103127:
  do {
    if ((this->m_taskQueue).m_nCount != 0) {
      while( true ) {
        LOCK();
        pCVar1 = &(this->m_taskQueue).m_lock;
        _Var2 = (pCVar1->m_bLock)._M_base._M_i;
        (pCVar1->m_bLock)._M_base._M_i = true;
        UNLOCK();
        if ((_Var2 & 1U) == 0) break;
        do {
        } while (((this->m_taskQueue).m_lock.m_bLock._M_base._M_i & 1U) != 0);
      }
      uVar3 = (this->m_taskQueue).m_nCount;
      if (uVar3 == 0) {
        (this->m_taskQueue).m_lock.m_bLock._M_base._M_i = false;
      }
      else {
        uVar6 = uVar3 - 1;
        pCVar4 = (this->m_taskQueue).m_pItems[uVar6];
        (this->m_taskQueue).m_nCount = uVar6;
        (this->m_taskQueue).m_lock.m_bLock._M_base._M_i = false;
        if (pCVar4 != (CTask *)0x0) {
          (*pCVar4->_vptr_CTask[2])(pCVar4,this);
          LOCK();
          (pCVar4->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i =
               (pCVar4->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i - 1;
          UNLOCK();
          goto LAB_00103127;
        }
      }
    }
    bVar5 = FindWork(this);
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void DoWork() noexcept
		{
			do
			{
				while (CTask* pTask = PopTask())
				{
					ExecuteTask(pTask);
				}
			} while (FindWork());
		}